

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O1

void __thiscall variant_visit_empty_Test::TestBody(variant_visit_empty_Test *this)

{
  bool bVar1;
  undefined8 *puVar2;
  Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B> local_20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18;
  AssertHelper local_10;
  
  local_20.storage_ = (storage_type)0x0;
  local_20.index_ = '\0';
  local_20._5_3_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    if (local_20.index_ == '\x01') {
      state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::
      get<(anonymous_namespace)::A,_0>(&local_20);
    }
    else {
      if (local_20.index_ == '\0') {
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__exception_00152c70;
        __cxa_throw(puVar2,&state_machine::variant::bad_variant_access::typeinfo,
                    std::exception::~exception);
      }
      state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::
      get<(anonymous_namespace)::B,_0>(&local_20);
    }
  }
  testing::Message::Message((Message *)&local_18);
  testing::internal::AssertHelper::AssertHelper
            (&local_10,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_variant.cc"
             ,199,
             "Expected: v.visit([](auto& a) { return a.value; }) throws an exception of type bad_variant_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
  testing::internal::AssertHelper::~AssertHelper(&local_10);
  if (local_18._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_18._M_head_impl + 8))();
  }
  state_machine::variant::Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B>::~Variant
            (&local_20);
  return;
}

Assistant:

TEST(variant, move_type) {
    static constexpr int expected = 42;

    Variant<A, B> v{};

    ASSERT_TRUE(v.holds<empty>());

    const auto& a = v.set(A{expected});

    EXPECT_EQ(a.value, expected);
    ASSERT_TRUE(v.holds<A>());
    EXPECT_EQ(v.get<A>().value, expected);
}